

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall ninx::parser::Parser::parse_level_2_expression(Parser *this)

{
  int iVar1;
  function<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_()>
  *in_RSI;
  long lVar2;
  initializer_list<ninx::parser::OperatorCaseDefinition> __l;
  allocator_type local_123;
  allocator local_122;
  allocator local_121;
  _Function_base local_120;
  code *local_108;
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  local_100;
  string local_e8;
  string local_c8;
  OperatorCaseDefinition local_a8 [2];
  
  if (parse_level_2_expression()::level_2_operators == '\0') {
    iVar1 = __cxa_guard_acquire(&parse_level_2_expression()::level_2_operators);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_c8,"+",&local_121);
      build_operator_case<ninx::parser::element::AddExpression>(local_a8,&local_c8);
      std::__cxx11::string::string((string *)&local_e8,"-",&local_122);
      build_operator_case<ninx::parser::element::SubtractExpression>(local_a8 + 1,&local_e8);
      __l._M_len = 2;
      __l._M_array = local_a8;
      std::
      vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
      ::vector(&parse_level_2_expression::level_2_operators,__l,&local_123);
      lVar2 = 0x40;
      do {
        OperatorCaseDefinition::~OperatorCaseDefinition
                  ((OperatorCaseDefinition *)((long)&local_a8[0].op._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0x40;
      } while (lVar2 != -0x40);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      __cxa_atexit(std::
                   vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
                   ::~vector,&parse_level_2_expression::level_2_operators,&__dso_handle);
      __cxa_guard_release(&parse_level_2_expression()::level_2_operators);
    }
  }
  local_120._M_functor._8_8_ = 0;
  local_108 = std::
              _Function_handler<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/Parser.cpp:307:33)>
              ::_M_invoke;
  local_120._M_manager =
       std::
       _Function_handler<std::unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/parser/Parser.cpp:307:33)>
       ::_M_manager;
  std::
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  ::vector(&local_100,&parse_level_2_expression::level_2_operators);
  parse_sub_expression
            (this,in_RSI,
             (vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
              *)&local_120);
  std::
  vector<ninx::parser::OperatorCaseDefinition,_std::allocator<ninx::parser::OperatorCaseDefinition>_>
  ::~vector(&local_100);
  std::_Function_base::~_Function_base(&local_120);
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> ninx::parser::Parser::parse_level_2_expression() {
    static std::vector<ninx::parser::OperatorCaseDefinition> level_2_operators = {
            build_operator_case<AddExpression>("+"),
            build_operator_case<SubtractExpression>("-")
    };

    return parse_sub_expression([this] {
        return parse_level_1_expression();
    }, level_2_operators);
}